

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O1

void boost::algorithm::
     trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  size_type sVar1;
  ulong uVar2;
  bool bVar3;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  size_type sVar4;
  undefined8 ****ppppuVar5;
  pointer pcVar6;
  anon_union_16_2_ba345be5_for_m_Storage local_60;
  ulong local_50;
  undefined8 ***local_48 [2];
  ulong local_38;
  
  pcVar6 = (Input->_M_dataplus)._M_p;
  sVar1 = Input->_M_string_length;
  uVar2 = IsSpace->m_Size;
  local_48[0] = (undefined8 ****)0x0;
  ppppuVar5 = local_48;
  local_38 = uVar2;
  if (0x10 < uVar2) {
    local_48[0] = (undefined8 ***)operator_new__(uVar2);
    IsSpace = (is_any_ofF<char> *)(IsSpace->m_Storage).m_dynSet;
    ppppuVar5 = (undefined8 ****)local_48[0];
  }
  memcpy(ppppuVar5,IsSpace,uVar2);
  uVar2 = local_38;
  local_50 = local_38;
  local_60.m_dynSet = (set_value_type *)0x0;
  if (local_38 < 0x11) {
    __dest = &local_60;
    ppppuVar5 = local_48;
  }
  else {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(local_38);
    ppppuVar5 = (undefined8 ****)local_48[0];
    local_60.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,ppppuVar5,uVar2);
  do {
    sVar4 = sVar1;
    if (sVar4 == 0) goto LAB_00156084;
    bVar3 = detail::is_any_ofF<char>::operator()((is_any_ofF<char> *)&local_60,pcVar6[sVar4 - 1]);
    sVar1 = sVar4 - 1;
  } while (bVar3);
  pcVar6 = pcVar6 + sVar4;
LAB_00156084:
  if ((0x10 < local_50) &&
     ((anon_union_16_2_ba345be5_for_m_Storage *)local_60.m_dynSet !=
      (anon_union_16_2_ba345be5_for_m_Storage *)0x0)) {
    operator_delete__(local_60.m_dynSet);
  }
  Input->_M_string_length = (long)pcVar6 - (long)(Input->_M_dataplus)._M_p;
  *pcVar6 = '\0';
  if ((0x10 < uVar2) && ((undefined8 ****)local_48[0] != (undefined8 ****)0x0)) {
    operator_delete__(local_48[0]);
  }
  return;
}

Assistant:

inline void trim_right_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase(
                ::boost::algorithm::detail::trim_end( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace ),
                ::boost::end(Input)
                );
        }